

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

bool __thiscall ELFIO::elfio::save(elfio *this,string *file_name)

{
  bool bVar1;
  ofstream stream;
  long local_218;
  filebuf local_210 [24];
  byte abStack_1f8 [216];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218);
  std::ofstream::open((char *)&local_218,(_Ios_Openmode)(file_name->_M_dataplus)._M_p);
  if ((abStack_1f8[*(long *)(local_218 + -0x18)] & 5) == 0) {
    bVar1 = save(this,(ostream *)&local_218);
  }
  else {
    bVar1 = false;
  }
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return bVar1;
}

Assistant:

bool save( const std::string& file_name )
    {
        std::ofstream stream;
        stream.open( file_name.c_str(), std::ios::out | std::ios::binary );
        if ( !stream ) {
            return false;
        }

        return save( stream );
    }